

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddKmap.c
# Opt level: O0

void Extra_PrintKMap(FILE *Output,DdManager *dd,DdNode *OnSet,DdNode *OffSet,int nVars,
                    DdNode **XVars,int fSuppType,char **pVarNames)

{
  int iVar1;
  int CodeWidth;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *n_00;
  DdNode *n_01;
  byte bVar9;
  DdNode *ValueOffSet;
  DdNode *ValueOnSet;
  DdNode *Prod;
  DdNode *CubeHorBDD;
  DdNode *CubeVerBDD;
  DdNode *TempSupp;
  int cVars;
  DdNode *Supp;
  DdNode *SuppOff;
  DdNode *SuppOn;
  int Value;
  DdNode *bPart;
  DdNode *bCube;
  int nSkipSpaces;
  int nCellsHor;
  int nCellsVer;
  int nVarsHor;
  int nVarsVer;
  int w;
  int h;
  int v;
  int s;
  int n;
  int p;
  int d;
  int fPrintTruth;
  DdNode **XVars_local;
  int nVars_local;
  DdNode *OffSet_local;
  DdNode *OnSet_local;
  DdManager *dd_local;
  FILE *Output_local;
  
  iVar1 = Cudd_bddLeq(dd,OnSet,(DdNode *)((ulong)OffSet ^ 1));
  if (iVar1 == 0) {
    fprintf((FILE *)Output,"PrintKMap(): The on-set and the off-set overlap\n");
  }
  else if (nVars == 0) {
    printf("Function is constant %d.\n",(ulong)((((ulong)OnSet & 1) != 0 ^ 0xffU) & 1));
  }
  else {
    printf("Truth table: ");
    if (nVars == 0) {
      printf("Constant");
    }
    else if (nVars == 1) {
      printf("1-var function");
    }
    else {
      n = 1 << ((char)nVars - 2U & 0x1f);
      while (n = n + -1, -1 < n) {
        SuppOn._4_4_ = 0;
        for (h = 0; h < 4; h = h + 1) {
          pDVar7 = Extra_bddBitsToCube(dd,n * 4 + h,nVars,dd->vars,0);
          Cudd_Ref(pDVar7);
          pDVar8 = Cudd_Cofactor(dd,OnSet,pDVar7);
          Cudd_Ref(pDVar8);
          SuppOn._4_4_ = (uint)(pDVar8 == dd->one) << ((byte)h & 0x1f) | SuppOn._4_4_;
          Cudd_RecursiveDeref(dd,pDVar8);
          Cudd_RecursiveDeref(dd,pDVar7);
        }
        if ((int)SuppOn._4_4_ < 10) {
          fprintf(_stdout,"%d",(ulong)SuppOn._4_4_);
        }
        else {
          fprintf(_stdout,"%c",(ulong)(SuppOn._4_4_ + 0x57));
        }
      }
    }
    printf("\n");
    if ((nVars < 0) || (0x14 < nVars)) {
      fprintf((FILE *)Output,
              "PrintKMap(): The number of variables is less than zero or more than %d\n",0x14);
    }
    else {
      XVars_local._4_4_ = nVars;
      if (XVars == (DdNode **)0x0) {
        if (fSuppType == 0) {
          if (nVars == 0) {
            __assert_fail("nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddKmap.c"
                          ,0x11c,
                          "void Extra_PrintKMap(FILE *, DdManager *, DdNode *, DdNode *, int, DdNode **, int, char **)"
                         );
          }
          for (w = 0; w < nVars; w = w + 1) {
            pDVar7 = Cudd_bddIthVar(dd,w);
            s_XVars[w] = pDVar7;
          }
        }
        else if (fSuppType == 1) {
          if (nVars == 0) {
            __assert_fail("nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddKmap.c"
                          ,0x122,
                          "void Extra_PrintKMap(FILE *, DdManager *, DdNode *, DdNode *, int, DdNode **, int, char **)"
                         );
          }
          for (w = 0; w < nVars; w = w + 1) {
            pDVar7 = Cudd_bddIthVar(dd,dd->invperm[w]);
            s_XVars[w] = pDVar7;
          }
        }
        else {
          TempSupp._4_4_ = 0;
          pDVar7 = Cudd_Support(dd,OnSet);
          Cudd_Ref(pDVar7);
          pDVar8 = Cudd_Support(dd,OffSet);
          Cudd_Ref(pDVar8);
          CubeVerBDD = Cudd_bddAnd(dd,pDVar7,pDVar8);
          Cudd_Ref(CubeVerBDD);
          Cudd_RecursiveDeref(dd,pDVar7);
          Cudd_RecursiveDeref(dd,pDVar8);
          XVars_local._4_4_ = Cudd_SupportSize(dd,CubeVerBDD);
          if (0x14 < XVars_local._4_4_) {
            fprintf((FILE *)Output,"PrintKMap(): The number of variables is more than %d\n",0x14);
            Cudd_RecursiveDeref(dd,CubeVerBDD);
            return;
          }
          for (; CubeVerBDD != dd->one;
              CubeVerBDD = *(DdNode **)(((ulong)CubeVerBDD & 0xfffffffffffffffe) + 0x10)) {
            pDVar7 = Cudd_bddIthVar(dd,CubeVerBDD->index);
            s_XVars[TempSupp._4_4_] = pDVar7;
            TempSupp._4_4_ = TempSupp._4_4_ + 1;
          }
          Cudd_RecursiveDeref(dd,CubeVerBDD);
        }
      }
      else {
        if (XVars == (DdNode **)0x0) {
          __assert_fail("XVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddKmap.c"
                        ,0x145,
                        "void Extra_PrintKMap(FILE *, DdManager *, DdNode *, DdNode *, int, DdNode **, int, char **)"
                       );
        }
        for (w = 0; w < nVars; w = w + 1) {
          s_XVars[w] = XVars[w];
        }
      }
      iVar1 = XVars_local._4_4_ / 2;
      CodeWidth = XVars_local._4_4_ - iVar1;
      iVar2 = 1 << ((byte)iVar1 & 0x1f);
      bVar9 = (byte)CodeWidth;
      iVar3 = 1 << (bVar9 & 0x1f);
      iVar4 = iVar1 + 1;
      fprintf((FILE *)Output,"\n",(long)XVars_local._4_4_ % 2 & 0xffffffff);
      for (nVarsHor = 0; nVarsHor < iVar1; nVarsHor = nVarsHor + 1) {
        if (pVarNames == (char **)0x0) {
          fprintf((FILE *)Output,"%c",(ulong)(uint)(CodeWidth + 0x61 + nVarsHor));
        }
        else {
          fprintf((FILE *)Output," %s",pVarNames[CodeWidth + nVarsHor]);
        }
      }
      if (fHorizontalVarNamesPrintedAbove != 0) {
        fprintf((FILE *)Output," \\ ");
        for (nVarsHor = 0; nVarsHor < CodeWidth; nVarsHor = nVarsHor + 1) {
          if (pVarNames == (char **)0x0) {
            fprintf((FILE *)Output,"%c",(ulong)(nVarsHor + 0x61));
          }
          else {
            fprintf((FILE *)Output,"%s ",pVarNames[nVarsHor]);
          }
        }
      }
      fprintf((FILE *)Output,"\n");
      if (fHorizontalVarNamesPrintedAbove != 0) {
        for (n = 0; n < CodeWidth; n = n + 1) {
          s = 0;
          while (s < iVar1 + 3) {
            s = s + 1;
            fprintf((FILE *)Output," ");
          }
          for (v = 0; v < iVar3; v = v + 1) {
            uVar5 = GrayCode(v);
            if ((uVar5 & 1 << ((bVar9 - 1) - (char)n & 0x1f)) == 0) {
              fprintf((FILE *)Output,"0   ");
            }
            else {
              fprintf((FILE *)Output,"1   ");
            }
          }
          fprintf((FILE *)Output,"\n");
        }
      }
      s = 0;
      while (s < iVar4) {
        s = s + 1;
        fprintf((FILE *)Output," ");
      }
      fprintf((FILE *)Output,"%c",0x2b);
      for (h = 0; h < iVar3; h = h + 1) {
        fprintf((FILE *)Output,"%c",0x2d);
        fprintf((FILE *)Output,"%c",0x2d);
        fprintf((FILE *)Output,"%c",0x2d);
        if (h != iVar3 + -1) {
          if ((h & 1U) == 0) {
            fprintf((FILE *)Output,"%c",0x2b);
          }
          else {
            fprintf((FILE *)Output,"%c",0x2b);
          }
        }
      }
      fprintf((FILE *)Output,"%c",0x2b);
      fprintf((FILE *)Output,"\n");
      for (w = 0; w < iVar2; w = w + 1) {
        for (v = 0; v < iVar1; v = v + 1) {
          uVar5 = GrayCode(w);
          if ((uVar5 & 1 << (((byte)iVar1 - 1) - (char)v & 0x1f)) == 0) {
            fprintf((FILE *)Output,"0");
          }
          else {
            fprintf((FILE *)Output,"1");
          }
        }
        fprintf((FILE *)Output," ");
        iVar6 = GrayCode(w);
        pDVar7 = Extra_bddBitsToCube(dd,iVar6,iVar1,s_XVars + CodeWidth,1);
        Cudd_Ref(pDVar7);
        fprintf((FILE *)Output,"%c",0x7c);
        for (nVarsVer = 0; nVarsVer < iVar3; nVarsVer = nVarsVer + 1) {
          fprintf((FILE *)Output," ");
          iVar6 = GrayCode(nVarsVer);
          pDVar8 = Extra_bddBitsToCube(dd,iVar6,CodeWidth,s_XVars,1);
          Cudd_Ref(pDVar8);
          n_00 = Cudd_bddAnd(dd,pDVar8,pDVar7);
          Cudd_Ref(n_00);
          Cudd_RecursiveDeref(dd,pDVar8);
          pDVar8 = Cudd_Cofactor(dd,OnSet,n_00);
          Cudd_Ref(pDVar8);
          n_01 = Cudd_Cofactor(dd,OffSet,n_00);
          Cudd_Ref(n_01);
          Cudd_RecursiveDeref(dd,n_00);
          if ((pDVar8 == dd->one) && (n_01 == (DdNode *)((ulong)dd->one ^ 1))) {
            fprintf((FILE *)Output,"%c",0x31);
          }
          else if ((pDVar8 == (DdNode *)((ulong)dd->one ^ 1)) && (n_01 == dd->one)) {
            fprintf((FILE *)Output,"%c",0x20);
          }
          else if ((pDVar8 == (DdNode *)((ulong)dd->one ^ 1)) &&
                  (n_01 == (DdNode *)((ulong)dd->one ^ 1))) {
            fprintf((FILE *)Output,"%c",0x2d);
          }
          else {
            if ((pDVar8 != dd->one) || (n_01 != dd->one)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddKmap.c"
                            ,0x1cc,
                            "void Extra_PrintKMap(FILE *, DdManager *, DdNode *, DdNode *, int, DdNode **, int, char **)"
                           );
            }
            fprintf((FILE *)Output,"%c",0x3f);
          }
          Cudd_RecursiveDeref(dd,pDVar8);
          Cudd_RecursiveDeref(dd,n_01);
          fprintf((FILE *)Output," ");
          if (nVarsVer != iVar3 + -1) {
            if ((nVarsVer & 1U) == 0) {
              fprintf((FILE *)Output,"%c",0x7c);
            }
            else {
              fprintf((FILE *)Output,"%c",0x7c);
            }
          }
        }
        fprintf((FILE *)Output,"%c",0x7c);
        fprintf((FILE *)Output,"\n");
        Cudd_RecursiveDeref(dd,pDVar7);
        if (w != iVar2 + -1) {
          s = 0;
          while (s < iVar4) {
            s = s + 1;
            fprintf((FILE *)Output," ");
          }
          if ((w & 1U) == 0) {
            fprintf((FILE *)Output,"%c",0x2b);
            for (h = 0; h < iVar3; h = h + 1) {
              fprintf((FILE *)Output,"%c",0x2d);
              fprintf((FILE *)Output,"%c",0x2d);
              fprintf((FILE *)Output,"%c",0x2d);
              if (h != iVar3 + -1) {
                if ((h & 1U) == 0) {
                  fprintf((FILE *)Output,"%c",0x2b);
                }
                else {
                  fprintf((FILE *)Output,"%c",0x2b);
                }
              }
            }
            fprintf((FILE *)Output,"%c",0x2b);
          }
          else {
            fprintf((FILE *)Output,"%c",0x2b);
            for (h = 0; h < iVar3; h = h + 1) {
              fprintf((FILE *)Output,"%c",0x2d);
              fprintf((FILE *)Output,"%c",0x2d);
              fprintf((FILE *)Output,"%c",0x2d);
              if (h != iVar3 + -1) {
                if ((h & 1U) == 0) {
                  fprintf((FILE *)Output,"%c",0x2b);
                }
                else {
                  fprintf((FILE *)Output,"%c",0x2b);
                }
              }
            }
            fprintf((FILE *)Output,"%c",0x2b);
          }
          fprintf((FILE *)Output,"\n");
        }
      }
      s = 0;
      while (s < iVar4) {
        s = s + 1;
        fprintf((FILE *)Output," ");
      }
      fprintf((FILE *)Output,"%c",0x2b);
      for (h = 0; h < iVar3; h = h + 1) {
        fprintf((FILE *)Output,"%c",0x2d);
        fprintf((FILE *)Output,"%c",0x2d);
        fprintf((FILE *)Output,"%c",0x2d);
        if (h != iVar3 + -1) {
          if ((h & 1U) == 0) {
            fprintf((FILE *)Output,"%c",0x2b);
          }
          else {
            fprintf((FILE *)Output,"%c",0x2b);
          }
        }
      }
      fprintf((FILE *)Output,"%c",0x2b);
      fprintf((FILE *)Output,"\n");
      if (fHorizontalVarNamesPrintedAbove == 0) {
        for (n = 0; n < CodeWidth; n = n + 1) {
          s = 0;
          while (s < iVar1 + 3) {
            s = s + 1;
            fprintf((FILE *)Output," ");
          }
          for (v = 0; v < iVar3; v = v + 1) {
            uVar5 = GrayCode(v);
            if ((uVar5 & 1 << ((bVar9 - 1) - (char)n & 0x1f)) == 0) {
              fprintf((FILE *)Output,"0   ");
            }
            else {
              fprintf((FILE *)Output,"1   ");
            }
          }
          fprintf((FILE *)Output,"%c",(ulong)(uint)(int)(char)((char)n + 'a'));
          fprintf((FILE *)Output,"\n");
        }
      }
    }
  }
  return;
}

Assistant:

void Extra_PrintKMap( 
  FILE * Output,  /* the output stream */
  DdManager * dd, 
  DdNode * OnSet, 
  DdNode * OffSet, 
  int nVars, 
  DdNode ** XVars, 
  int fSuppType, /* the flag which determines how support is computed */
  char ** pVarNames )
{
    int fPrintTruth = 1;
    int d, p, n, s, v, h, w;
    int nVarsVer;
    int nVarsHor;
    int nCellsVer;
    int nCellsHor;
    int nSkipSpaces;

    // make sure that on-set and off-set do not overlap
    if ( !Cudd_bddLeq( dd, OnSet, Cudd_Not(OffSet) ) )
    {
        fprintf( Output, "PrintKMap(): The on-set and the off-set overlap\n" );
        return;
    }
    if ( nVars == 0 )
        { printf( "Function is constant %d.\n", !Cudd_IsComplement(OnSet) ); return; }

    // print truth table for debugging
    if ( fPrintTruth )
    {
        DdNode * bCube, * bPart;
        printf( "Truth table: " );
        if ( nVars == 0 )
            printf( "Constant" );
        else if ( nVars == 1 )
            printf( "1-var function" );
        else
        {
//            printf( "0x" );
            for ( d = (1<<(nVars-2)) - 1; d >= 0; d-- )
            {
                int Value = 0;
                for ( s = 0; s < 4; s++ )
                {
                    bCube = Extra_bddBitsToCube( dd, 4*d+s, nVars, dd->vars, 0 );   Cudd_Ref( bCube );
                    bPart = Cudd_Cofactor( dd, OnSet, bCube );                      Cudd_Ref( bPart );
                    Value |= ((int)(bPart == b1) << s);
                    Cudd_RecursiveDeref( dd, bPart );
                    Cudd_RecursiveDeref( dd, bCube );
                }
                if ( Value < 10 )
                    fprintf( stdout, "%d", Value );
                else
                    fprintf( stdout, "%c", 'a' + Value-10 );
            }
        }
        printf( "\n" );
    }


/*
    if ( OnSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 1\n" );
        return;
    }
    if ( OffSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 0\n" );
        return;
    }
*/
    if ( nVars < 0 || nVars > MAXVARS )
    {
        fprintf( Output, "PrintKMap(): The number of variables is less than zero or more than %d\n", MAXVARS );
        return;
    }

    // determine the support if it is not given
    if ( XVars == NULL )
    {
        if ( fSuppType == 0 )
        {   // assume that the support includes the first nVars of the manager
            assert( nVars );
            for ( v = 0; v < nVars; v++ )
                s_XVars[v] = Cudd_bddIthVar( dd, v );
        }
        else if ( fSuppType == 1 )
        {   // assume that the support includes the topmost nVars of the manager
            assert( nVars );
            for ( v = 0; v < nVars; v++ )
                s_XVars[v] = Cudd_bddIthVar( dd, dd->invperm[v] );
        }
        else // determine the support
        {
            DdNode * SuppOn, * SuppOff, * Supp;
            int cVars = 0;
            DdNode * TempSupp;

            // determine support
            SuppOn = Cudd_Support( dd, OnSet );         Cudd_Ref( SuppOn );
            SuppOff = Cudd_Support( dd, OffSet );       Cudd_Ref( SuppOff );
            Supp = Cudd_bddAnd( dd, SuppOn, SuppOff );  Cudd_Ref( Supp );
            Cudd_RecursiveDeref( dd, SuppOn );
            Cudd_RecursiveDeref( dd, SuppOff );

            nVars = Cudd_SupportSize( dd, Supp );
            if ( nVars > MAXVARS )
            {
                fprintf( Output, "PrintKMap(): The number of variables is more than %d\n", MAXVARS );
                Cudd_RecursiveDeref( dd, Supp );
                return;
            }

            // assign variables
            for ( TempSupp = Supp; TempSupp != dd->one; TempSupp = Cudd_T(TempSupp), cVars++ )
                s_XVars[cVars] = Cudd_bddIthVar( dd, TempSupp->index );

            Cudd_RecursiveDeref( dd, TempSupp );
        }
    }
    else
    {
        // copy variables
        assert( XVars );
        for ( v = 0; v < nVars; v++ )
            s_XVars[v] = XVars[v];
    }

    ////////////////////////////////////////////////////////////////////
    // determine the Karnaugh map parameters
    nVarsVer = nVars/2;
    nVarsHor = nVars - nVarsVer;

    nCellsVer = (1<<nVarsVer);
    nCellsHor = (1<<nVarsHor);
    nSkipSpaces = nVarsVer + 1;

    ////////////////////////////////////////////////////////////////////
    // print variable names
    fprintf( Output, "\n" );
    for ( w = 0; w < nVarsVer; w++ )
        if ( pVarNames == NULL )
            fprintf( Output, "%c", 'a'+nVarsHor+w );
        else
            fprintf( Output, " %s", pVarNames[nVarsHor+w] );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        fprintf( Output, " \\ " );
        for ( w = 0; w < nVarsHor; w++ )
            if ( pVarNames == NULL )
                fprintf( Output, "%c", 'a'+w );
            else
                fprintf( Output, "%s ", pVarNames[w] );
    }
    fprintf( Output, "\n" );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );
            fprintf( Output, "\n" );
        }
    }

    ////////////////////////////////////////////////////////////////////
    // print the upper line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_TOP_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_BOT );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_BOT );
        }
    }
    fprintf( Output, "%c", DOUBLE_TOP_RIGHT );
    fprintf( Output, "\n" );

    ////////////////////////////////////////////////////////////////////
    // print the map
    for ( v = 0; v < nCellsVer; v++ )
    {
        DdNode * CubeVerBDD;

        // print horizontal digits
//      for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
        for ( n = 0; n < nVarsVer; n++ )
            if ( GrayCode(v) & (1<<(nVarsVer-1-n)) )
                fprintf( Output, "1" );
            else
                fprintf( Output, "0" );
        fprintf( Output, " " );

        // find vertical cube
        CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nVarsVer, s_XVars+nVarsHor, 1 );    Cudd_Ref( CubeVerBDD );

        // print text line
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        for ( h = 0; h < nCellsHor; h++ )
        {
            DdNode * CubeHorBDD, * Prod, * ValueOnSet, * ValueOffSet;

            fprintf( Output, " " );
//          fprintf( Output, "x" );
            ///////////////////////////////////////////////////////////////
            // determine what should be printed
            CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nVarsHor, s_XVars, 1 );    Cudd_Ref( CubeHorBDD );
            Prod = Cudd_bddAnd( dd, CubeHorBDD, CubeVerBDD );                   Cudd_Ref( Prod );
            Cudd_RecursiveDeref( dd, CubeHorBDD );

            ValueOnSet  = Cudd_Cofactor( dd, OnSet, Prod );                     Cudd_Ref( ValueOnSet );
            ValueOffSet = Cudd_Cofactor( dd, OffSet, Prod );                    Cudd_Ref( ValueOffSet );
            Cudd_RecursiveDeref( dd, Prod );

#ifdef WIN32
            {
            HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
            char Symb = 0, Color = 0;
            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                Symb = SYMBOL_ONE,     Color = 14;  // yellow
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                Symb = SYMBOL_ZERO,    Color = 11;  // blue
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                Symb = SYMBOL_DC,      Color = 10;  // green
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                Symb = SYMBOL_OVERLAP, Color = 12;  // red
            else
                assert(0);
            SetConsoleTextAttribute( hConsole, Color );
            fprintf( Output, "%c", Symb );
            SetConsoleTextAttribute( hConsole, 7 );
            }
#else
            {
            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                fprintf( Output, "%c", SYMBOL_ONE );
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                fprintf( Output, "%c", SYMBOL_ZERO );
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                fprintf( Output, "%c", SYMBOL_DC );
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                fprintf( Output, "%c", SYMBOL_OVERLAP );
            else
                assert(0);
            }
#endif

            Cudd_RecursiveDeref( dd, ValueOnSet );
            Cudd_RecursiveDeref( dd, ValueOffSet );
            ///////////////////////////////////////////////////////////////
            fprintf( Output, " " );

            if ( h != nCellsHor-1 )
            {
                if ( h&1 )
                    fprintf( Output, "%c", DOUBLE_VERTICAL );
                else
                    fprintf( Output, "%c", SINGLE_VERTICAL );
            }
        }
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        fprintf( Output, "\n" );

        Cudd_RecursiveDeref( dd, CubeVerBDD );

        if ( v != nCellsVer-1 )
        // print separator line
        {
            for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
            if ( v&1 )
            {
                fprintf( Output, "%c", D_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", DOUBLES_CROSS );
                        else
                            fprintf( Output, "%c", S_VER_CROSS_D_HOR );
                    }
                }
                fprintf( Output, "%c", D_JOINS_D_VER_LEFT );
            }
            else
            {
                fprintf( Output, "%c", S_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", S_HOR_CROSS_D_VER );
                        else
                            fprintf( Output, "%c", SINGLES_CROSS );
                    }
                }
                fprintf( Output, "%c", S_JOINS_D_VER_LEFT );
            }
            fprintf( Output, "\n" );
        }
    }
    
    ////////////////////////////////////////////////////////////////////
    // print the lower line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_BOT_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_TOP );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_TOP );
        }
    }
    fprintf( Output, "%c", DOUBLE_BOT_RIGHT );
    fprintf( Output, "\n" );

    if ( !fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );

            /////////////////////////////////
            fprintf( Output, "%c", (char)('a'+d) );
            /////////////////////////////////
            fprintf( Output, "\n" );
        }
    }
}